

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputNameComponent
          (VClient *this,string *i_rDeviceName,uint i_DeviceOutputIndex,string *o_rDeviceOutputName,
          string *o_rComponentName,Enum *o_rDeviceOutputUnit)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  Enum EVar4;
  uint uVar5;
  string *i_rDeviceOutputName;
  VClient *this_00;
  pointer rChannel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint DeviceID;
  Enum *local_70;
  Enum GetResult;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  local_70 = o_rDeviceOutputUnit;
  bVar3 = InitGet<std::__cxx11::string,std::__cxx11::string,ViconDataStreamSDK::Core::Unit::Enum>
                    (this,&GetResult,o_rDeviceOutputName,o_rComponentName,o_rDeviceOutputUnit);
  EVar4 = GetResult;
  if (bVar3) {
    DeviceID = 0;
    EVar4 = GetDeviceID(this,i_rDeviceName,&DeviceID);
    if (EVar4 == Success) {
      bVar3 = IsForcePlateDevice(this,DeviceID);
      uVar5 = 0;
      for (rChannel = (this->m_LatestFrame).m_Channels.
                      super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          rChannel !=
          (this->m_LatestFrame).m_Channels.
          super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish; rChannel = rChannel + 1) {
        if (rChannel->m_DeviceID == DeviceID) {
          for (i_rDeviceOutputName =
                    (rChannel->m_ComponentNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              i_rDeviceOutputName !=
              (rChannel->m_ComponentNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
              i_rDeviceOutputName = i_rDeviceOutputName + 1) {
            if (i_DeviceOutputIndex == uVar5) {
              std::__cxx11::string::_M_assign((string *)o_rDeviceOutputName);
              ClientUtils::AdaptDeviceOutputName
                        ((string *)&stack0xffffffffffffffb0,i_rDeviceOutputName,i_DeviceOutputIndex)
              ;
              this_00 = (VClient *)&stack0xffffffffffffffb0;
              std::__cxx11::string::operator=((string *)o_rComponentName,(string *)this_00);
              std::__cxx11::string::~string((string *)this_00);
              if (!bVar3) {
                *local_70 = Unknown;
                pVVar1 = (this->m_LatestFrame).m_ChannelUnits.
                         super__Vector_base<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pVVar2 = (this->m_LatestFrame).m_ChannelUnits.
                         super__Vector_base<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                goto LAB_0012361b;
              }
              bVar3 = IsForcePlateForceChannel(this_00,rChannel);
              EVar4 = Success;
              if (!bVar3) {
                bVar3 = IsForcePlateMomentChannel(this_00,rChannel);
                if (bVar3) {
                  EVar4 = InvalidHostName;
                }
                else {
                  bVar3 = IsForcePlateCoPChannel(this_00,rChannel);
                  EVar4 = (uint)bVar3 + (uint)bVar3 * 2 + NotImplemented;
                }
              }
              *local_70 = EVar4;
              EVar4 = Success;
              goto LAB_0012356a;
            }
            uVar5 = uVar5 + 1;
          }
        }
      }
      EVar4 = InvalidIndex;
    }
  }
LAB_0012356a:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar4;
LAB_0012361b:
  __lhs = &pVVar1->m_Unit;
  if ((pointer)&__lhs[-1].field_2 == pVVar2) goto LAB_001239aa;
  if ((*(uint *)((long)&__lhs[-1].field_2 + 8) == DeviceID) &&
     (*(UInt32 *)((long)&__lhs[-1].field_2 + 0xc) == rChannel->m_ChannelID)) {
    bVar3 = std::operator==(__lhs,"meter");
    EVar4 = InvalidMulticastIP;
    if (!bVar3) {
      bVar3 = std::operator==(__lhs,"kilogram");
      EVar4 = NullClient;
      if (!bVar3) {
        bVar3 = std::operator==(__lhs,"second");
        EVar4 = ClientAlreadyConnected;
        if (!bVar3) {
          bVar3 = std::operator==(__lhs,"ampere");
          EVar4 = ClientConnectionFailed;
          if (!bVar3) {
            bVar3 = std::operator==(__lhs,"kelvin");
            EVar4 = ServerAlreadyTransmittingMulticast;
            if (!bVar3) {
              bVar3 = std::operator==(__lhs,"mole");
              EVar4 = ServerNotTransmittingMulticast;
              if (!bVar3) {
                bVar3 = std::operator==(__lhs,"candela");
                EVar4 = NotConnected;
                if (!bVar3) {
                  bVar3 = std::operator==(__lhs,"radian");
                  EVar4 = NoFrame;
                  if (!bVar3) {
                    bVar3 = std::operator==(__lhs,"steradian");
                    EVar4 = InvalidIndex;
                    if (!bVar3) {
                      bVar3 = std::operator==(__lhs,"meter squared");
                      EVar4 = InvalidCameraName;
                      if (!bVar3) {
                        bVar3 = std::operator==(__lhs,"meter cubed");
                        EVar4 = InvalidSubjectName;
                        if (!bVar3) {
                          bVar3 = std::operator==(__lhs,"meter per second");
                          EVar4 = InvalidSegmentName;
                          if (!bVar3) {
                            bVar3 = std::operator==(__lhs,"meter per second squared");
                            EVar4 = InvalidMarkerName;
                            if (!bVar3) {
                              bVar3 = std::operator==(__lhs,"radian per second");
                              EVar4 = InvalidDeviceName;
                              if (!bVar3) {
                                bVar3 = std::operator==(__lhs,"radian per second squared");
                                EVar4 = InvalidDeviceOutputName;
                                if (!bVar3) {
                                  bVar3 = std::operator==(__lhs,"hertz");
                                  EVar4 = InvalidLatencySampleName;
                                  if (!bVar3) {
                                    bVar3 = std::operator==(__lhs,"newton");
                                    EVar4 = Success;
                                    if (!bVar3) {
                                      bVar3 = std::operator==(__lhs,"joule");
                                      EVar4 = InvalidFrameRateName;
                                      if (!bVar3) {
                                        bVar3 = std::operator==(__lhs,"watt");
                                        EVar4 = CoLinearAxes;
                                        if (!bVar3) {
                                          bVar3 = std::operator==(__lhs,"pascal");
                                          EVar4 = LeftHandedAxes;
                                          if (!bVar3) {
                                            bVar3 = std::operator==(__lhs,"lumen");
                                            EVar4 = HapticAlreadySet;
                                            if (!bVar3) {
                                              bVar3 = std::operator==(__lhs,"lux");
                                              EVar4 = EarlyDataRequested;
                                              if (!bVar3) {
                                                bVar3 = std::operator==(__lhs,"coulomb");
                                                EVar4 = LateDataRequested;
                                                if (!bVar3) {
                                                  bVar3 = std::operator==(__lhs,"volt");
                                                  EVar4 = NotImplemented;
                                                  if (!bVar3) {
                                                    bVar3 = std::operator==(__lhs,"ohm");
                                                    EVar4 = InvalidOperation;
                                                    if (!bVar3) {
                                                      bVar3 = std::operator==(__lhs,"farad");
                                                      EVar4 = NotSupported;
                                                      if (!bVar3) {
                                                        bVar3 = std::operator==(__lhs,"weber");
                                                        EVar4 = ConfigurationFailed;
                                                        if (!bVar3) {
                                                          bVar3 = std::operator==(__lhs,"tesla");
                                                          EVar4 = NotPresent;
                                                          if (!bVar3) {
                                                            bVar3 = std::operator==(__lhs,"henry");
                                                            EVar4 = ConfigurationFailed|Success;
                                                            if (!bVar3) {
                                                              bVar3 = std::operator==(__lhs,
                                                  "siemens");
                                                  EVar4 = ConfigurationFailed|InvalidHostName;
                                                  if (!bVar3) {
                                                    bVar3 = std::operator==(__lhs,"becquerel");
                                                    EVar4 = 0x20;
                                                    if (!bVar3) {
                                                      bVar3 = std::operator==(__lhs,"gray");
                                                      EVar4 = 0x21;
                                                      if (!bVar3) {
                                                        bVar3 = std::operator==(__lhs,"sievert");
                                                        EVar4 = 0x22;
                                                        if (!bVar3) {
                                                          bVar3 = std::operator==(__lhs,"katal");
                                                          EVar4 = 0x23;
                                                          if (!bVar3) goto LAB_001239a1;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *local_70 = EVar4;
  }
LAB_001239a1:
  pVVar1 = (pointer)(__lhs + 2);
  goto LAB_0012361b;
LAB_001239aa:
  EVar4 = Success;
  goto LAB_0012356a;
}

Assistant:

Result::Enum VClient::GetDeviceOutputNameComponent( const std::string  & i_rDeviceName,
                                           const unsigned int   i_DeviceOutputIndex,
                                                 std::string  & o_rDeviceOutputName,
                                                 std::string  & o_rComponentName,
                                                 Unit::Enum   & o_rDeviceOutputUnit ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputName, o_rComponentName, o_rDeviceOutputUnit ) )
  {
    return GetResult; 
  }

  // Get the device id
  unsigned int DeviceID = 0;
  Result::Enum _Result = GetDeviceID( i_rDeviceName, DeviceID );
  if( Result::Success != _Result )
  {
    return _Result;
  }

  // Is this a forceplate?
  const bool bIsForcePlate( IsForcePlateDevice( DeviceID ) );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  const std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for( ; ChannelIt != ChannelEnd ; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( ; ComponentIt != ComponentEnd ; ++ComponentIt )
    {
      if( CurrentDeviceOutputIndex == i_DeviceOutputIndex )
      {
        o_rDeviceOutputName = rChannel.m_Name;
        o_rComponentName = AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex );

        if( bIsForcePlate )
        {
          // Determine where the data lives in this channel
          if( IsForcePlateForceChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Newton;
          }
          else if( IsForcePlateMomentChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::NewtonMeter;
          }
          else if( IsForcePlateCoPChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Meter;
          }
          else
          {
            o_rDeviceOutputUnit = Unit::Volt;
          }
        }
        else
        {
          // Not a forceplate.
          o_rDeviceOutputUnit = Unit::Unknown;

          // Look for information in the extra channel information.

          std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitIt  = m_LatestFrame.m_ChannelUnits.begin();
          const std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitEnd = m_LatestFrame.m_ChannelUnits.end();
          for( ; ChannelUnitIt != ChannelUnitEnd ; ++ChannelUnitIt )
          {
            const ViconCGStream::VChannelInfoExtra & rChannelInfoExtra( *ChannelUnitIt );

            // Wrong Device
            if( rChannelInfoExtra.m_DeviceID != DeviceID )
            {
              continue;
            }

            // Wrong Channel
            if( rChannelInfoExtra.m_ChannelID != rChannel.m_ChannelID )
            {
              continue;
            }

            if( rChannelInfoExtra.m_Unit == "meter" )
            {
              o_rDeviceOutputUnit = Unit::Meter;
            }
            else if( rChannelInfoExtra.m_Unit == "kilogram" )
            {
              o_rDeviceOutputUnit = Unit::Kilogram;
            }
            else if( rChannelInfoExtra.m_Unit == "second" )
            {
              o_rDeviceOutputUnit = Unit::Second;
            }
            else if( rChannelInfoExtra.m_Unit == "ampere" )
            {
              o_rDeviceOutputUnit = Unit::Ampere;
            }
            else if( rChannelInfoExtra.m_Unit == "kelvin" )
            {
              o_rDeviceOutputUnit = Unit::Kelvin;
            }
            else if( rChannelInfoExtra.m_Unit == "mole" )
            {
              o_rDeviceOutputUnit = Unit::Mole;
            }
            else if( rChannelInfoExtra.m_Unit == "candela" )
            {
              o_rDeviceOutputUnit = Unit::Candela;
            }
            else if( rChannelInfoExtra.m_Unit == "radian" )
            {
              o_rDeviceOutputUnit = Unit::Radian;
            }
            else if( rChannelInfoExtra.m_Unit == "steradian" )
            {
              o_rDeviceOutputUnit = Unit::Steradian;
            }
            else if( rChannelInfoExtra.m_Unit == "meter squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "meter cubed" )
            {
              o_rDeviceOutputUnit = Unit::MeterCubed;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second squared" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "hertz" )
            {
              o_rDeviceOutputUnit = Unit::Hertz;
            }
            else if( rChannelInfoExtra.m_Unit == "newton" )
            {
              o_rDeviceOutputUnit = Unit::Newton;
            }
            else if( rChannelInfoExtra.m_Unit == "joule" )
            {
              o_rDeviceOutputUnit = Unit::Joule;
            }
            else if( rChannelInfoExtra.m_Unit == "watt" )
            {
              o_rDeviceOutputUnit = Unit::Watt;
            }
            else if( rChannelInfoExtra.m_Unit == "pascal" )
            {
              o_rDeviceOutputUnit = Unit::Pascal;
            }
            else if( rChannelInfoExtra.m_Unit == "lumen" )
            {
              o_rDeviceOutputUnit = Unit::Lumen;
            }
            else if( rChannelInfoExtra.m_Unit == "lux" )
            {
              o_rDeviceOutputUnit = Unit::Lux;
            }
            else if( rChannelInfoExtra.m_Unit == "coulomb" )
            {
              o_rDeviceOutputUnit = Unit::Coulomb;
            }
            else if( rChannelInfoExtra.m_Unit == "volt" )
            {
              o_rDeviceOutputUnit = Unit::Volt;
            }
            else if( rChannelInfoExtra.m_Unit == "ohm" )
            {
              o_rDeviceOutputUnit = Unit::Ohm;
            }
            else if( rChannelInfoExtra.m_Unit == "farad" )
            {
              o_rDeviceOutputUnit = Unit::Farad;
            }
            else if( rChannelInfoExtra.m_Unit == "weber" )
            {
              o_rDeviceOutputUnit = Unit::Weber;
            }
            else if( rChannelInfoExtra.m_Unit == "tesla" )
            {
              o_rDeviceOutputUnit = Unit::Tesla;
            }
            else if( rChannelInfoExtra.m_Unit == "henry" )
            {
              o_rDeviceOutputUnit = Unit::Henry;
            }
            else if( rChannelInfoExtra.m_Unit == "siemens" )
            {
              o_rDeviceOutputUnit = Unit::Siemens;
            }
            else if( rChannelInfoExtra.m_Unit == "becquerel" )
            {
              o_rDeviceOutputUnit = Unit::Becquerel;
            }
            else if( rChannelInfoExtra.m_Unit == "gray" )
            {
              o_rDeviceOutputUnit = Unit::Gray;
            }
            else if( rChannelInfoExtra.m_Unit == "sievert" )
            {
              o_rDeviceOutputUnit = Unit::Sievert;
            }
            else if( rChannelInfoExtra.m_Unit == "katal" )
            {
              o_rDeviceOutputUnit = Unit::Katal;
            }

          }
        }

        return Result::Success;
      }
      else
      {
        ++CurrentDeviceOutputIndex;
      }
    }
  }
  return Result::InvalidIndex;
}